

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

int sdsull2str(char *s,unsigned_long_long v)

{
  char cVar1;
  undefined1 auVar2 [16];
  char *pcVar3;
  size_t l;
  char *pcStack_20;
  char aux;
  char *p;
  unsigned_long_long v_local;
  char *s_local;
  
  pcVar3 = s;
  p = (char *)v;
  do {
    pcStack_20 = pcVar3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = p;
    pcVar3 = pcStack_20 + 1;
    *pcStack_20 = SUB161(auVar2 % ZEXT816(10),0) + '0';
    p = (char *)((ulong)p / 10);
  } while (p != (char *)0x0);
  *pcVar3 = '\0';
  for (v_local = (unsigned_long_long)s; v_local < pcStack_20; v_local = v_local + 1) {
    cVar1 = *(char *)v_local;
    *(char *)v_local = *pcStack_20;
    *pcStack_20 = cVar1;
    pcStack_20 = pcStack_20 + -1;
  }
  return (int)pcVar3 - (int)s;
}

Assistant:

int sdsull2str(char *s, unsigned long long v) {
    char *p, aux;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}